

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O0

char * google::protobuf::internal::VarintParser<int,false>(void *object,char *ptr,ParseContext *ctx)

{
  char *pcVar1;
  char *in_RDX;
  EpsCopyInputStream *in_RSI;
  anon_class_8_1_6424947d in_RDI;
  
  pcVar1 = EpsCopyInputStream::
           ReadPackedVarint<google::protobuf::internal::VarintParser<int,false>(void*,char_const*,google::protobuf::internal::ParseContext*)::_lambda(unsigned_long)_1_>
                     (in_RSI,in_RDX,in_RDI);
  return pcVar1;
}

Assistant:

const char* VarintParser(void* object, const char* ptr, ParseContext* ctx) {
  return ctx->ReadPackedVarint(ptr, [object](uint64 varint) {
    T val;
    if (sign) {
      if (sizeof(T) == 8) {
        val = WireFormatLite::ZigZagDecode64(varint);
      } else {
        val = WireFormatLite::ZigZagDecode32(varint);
      }
    } else {
      val = varint;
    }
    static_cast<RepeatedField<T>*>(object)->Add(val);
  });
}